

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.cxx
# Opt level: O2

void __thiscall cmCMakePath::GetNativePath(cmCMakePath *this,string *path)

{
  path tmp;
  path pStack_58;
  string local_30;
  
  std::filesystem::__cxx11::path::path(&pStack_58,&this->Path);
  std::filesystem::__cxx11::path::string(&local_30,&pStack_58);
  std::__cxx11::string::operator=((string *)path,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::filesystem::__cxx11::path::~path(&pStack_58);
  return;
}

Assistant:

void cmCMakePath::GetNativePath(std::string& path) const
{
  cm::filesystem::path tmp(this->Path);
  tmp.make_preferred();

  path = tmp.string();
}